

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForthScriptCpp.h
# Opt level: O3

void __thiscall cppforth::Forth::markerremove(Forth *this)

{
  uint uVar1;
  uint uVar2;
  ulong uVar3;
  long lVar4;
  ulong uVar5;
  pointer pDVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  
  requireDStackDepth(this,1,"MARKERREMOVE");
  uVar2 = ForthStack<unsigned_int>::getTop(&this->dStack);
  ForthStack<unsigned_int>::pop(&this->dStack);
  uVar5 = (ulong)uVar2;
  pDVar6 = (this->definitions).
           super__Vector_base<cppforth::Forth::Definition,_std::allocator<cppforth::Forth::Definition>_>
           ._M_impl.super__Vector_impl_data._M_start;
  uVar3 = ((long)(this->definitions).
                 super__Vector_base<cppforth::Forth::Definition,_std::allocator<cppforth::Forth::Definition>_>
                 ._M_impl.super__Vector_impl_data._M_finish - (long)pDVar6 >> 4) *
          -0x3333333333333333;
  if (uVar5 <= uVar3 && uVar3 - uVar5 != 0) {
    lVar4 = uVar5 * 0x50 + 0x48;
    do {
      this_00 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                (lVar4 + -0x28 + (long)pDVar6);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                (this_00,"_deleted");
      uVar2 = *(uint *)((long)&this_00[-1].field_2 + 8);
      uVar1 = (uint)this_00[1]._M_string_length;
      if ((uVar1 & uVar2) == 0) {
        *(uint *)((long)pDVar6 + lVar4 + -0x30) = uVar1 ^ uVar2;
      }
      uVar5 = uVar5 + 1;
      pDVar6 = (this->definitions).
               super__Vector_base<cppforth::Forth::Definition,_std::allocator<cppforth::Forth::Definition>_>
               ._M_impl.super__Vector_impl_data._M_start;
      lVar4 = lVar4 + 0x50;
    } while (uVar5 < (ulong)(((long)(this->definitions).
                                    super__Vector_base<cppforth::Forth::Definition,_std::allocator<cppforth::Forth::Definition>_>
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)pDVar6 >> 4)
                            * -0x3333333333333333));
  }
  return;
}

Assistant:

void markerremove() {
			REQUIRE_DSTACK_DEPTH(1, "MARKERREMOVE");
			Cell defn = dStack.getTop(); dStack.pop();
			for (size_t i = defn; i<definitions.size(); ++i) {
				auto& def = definitions[i];
				def.name.append("_deleted");
				if (!def.isHidden()) {
					def.toggleHidden();
				}
			}
		}